

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O0

void __thiscall capnp::Type::Type(Type *this,Which primitive)

{
  bool bVar1;
  Which primitive_local;
  Type *this_local;
  
  this->baseType = primitive;
  this->listDepth = '\0';
  this->isImplicitParam = false;
  bVar1 = false;
  if (((primitive != STRUCT) && (bVar1 = false, primitive != ENUM)) &&
     (bVar1 = false, primitive != INTERFACE)) {
    bVar1 = primitive != LIST;
  }
  if (!bVar1) {
    kj::_::inlineRequireFailure
              ("/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema.h"
               ,0x386,
               "primitive != schema::Type::STRUCT && primitive != schema::Type::ENUM && primitive != schema::Type::INTERFACE && primitive != schema::Type::LIST"
               ,"",(char *)0x0);
  }
  if (primitive == ANY_POINTER) {
    (this->field_4).schema = (RawBrandedSchema *)0x0;
    (this->field_3).paramIndex = 0;
  }
  else {
    (this->field_4).schema = (RawBrandedSchema *)0x0;
  }
  return;
}

Assistant:

inline Type::Type(schema::Type::Which primitive)
    : baseType(primitive), listDepth(0), isImplicitParam(false) {
  KJ_IREQUIRE(primitive != schema::Type::STRUCT &&
              primitive != schema::Type::ENUM &&
              primitive != schema::Type::INTERFACE &&
              primitive != schema::Type::LIST);
  if (primitive == schema::Type::ANY_POINTER) {
    scopeId = 0;
    anyPointerKind = schema::Type::AnyPointer::Unconstrained::ANY_KIND;
  } else {
    schema = nullptr;
  }
}